

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O1

_Bool imap_endofresp(connectdata *conn,char *line,size_t len,int *resp)

{
  ulong uVar1;
  imapstate iVar2;
  Curl_easy *data;
  void *pvVar3;
  _Bool _Var4;
  int iVar5;
  int iVar6;
  size_t __n;
  char *pcVar7;
  
  data = conn->data;
  pvVar3 = (data->req).protop;
  pcVar7 = &(conn->proto).ftpc.transfertype;
  __n = strlen(pcVar7);
  uVar1 = __n + 1;
  if (((uVar1 <= len) && (iVar5 = bcmp(pcVar7,line,__n), iVar5 == 0)) && (line[__n] == ' ')) {
    if (len - uVar1 < 2) {
LAB_001366ce:
      pcVar7 = "Bad tagged response";
      if ((len - uVar1 < 3) || (line[__n + 3] != 'D' || *(short *)(line + uVar1) != 0x4142))
      goto LAB_00136765;
      iVar5 = 0x42;
    }
    else if (*(short *)(line + uVar1) == 0x4b4f) {
      iVar5 = 0x4f;
    }
    else {
      if (*(short *)(line + uVar1) != 0x4f4e) goto LAB_001366ce;
      iVar5 = 0x4e;
    }
    goto switchD_001367a3_caseD_8;
  }
  if ((len < 2) || (*(short *)line != 0x202a)) {
    if (pvVar3 == (void *)0x0) {
      return false;
    }
    if (*(long *)((long)pvVar3 + 0x38) != 0) {
      return false;
    }
    if ((len != 3) || (*line != '+')) {
      if (len < 2) {
        return false;
      }
      if (*(short *)line != 0x202b) {
        return false;
      }
    }
    iVar2 = (conn->proto).imapc.state;
    iVar5 = 0x2b;
    if ((iVar2 != IMAP_AUTHENTICATE) && (iVar2 != IMAP_APPEND)) {
      pcVar7 = "Unexpected continuation response";
LAB_00136765:
      Curl_failf(data,pcVar7);
      iVar5 = -1;
    }
    goto switchD_001367a3_caseD_8;
  }
  _Var4 = false;
  iVar5 = 0x2a;
  switch((conn->proto).imapc.state) {
  case IMAP_CAPABILITY:
    pcVar7 = "CAPABILITY";
    break;
  default:
    goto switchD_001367a3_caseD_3;
  case IMAP_LIST:
    if ((*(long *)((long)pvVar3 + 0x38) == 0) && (_Var4 = imap_matchresp(line,len,"LIST"), !_Var4))
    {
      return false;
    }
    if (((*(char **)((long)pvVar3 + 0x38) != (char *)0x0) &&
        (_Var4 = imap_matchresp(line,len,*(char **)((long)pvVar3 + 0x38)), !_Var4)) &&
       ((iVar6 = strcmp(*(char **)((long)pvVar3 + 0x38),"STORE"), iVar6 != 0 ||
        (_Var4 = imap_matchresp(line,len,"FETCH"), !_Var4)))) {
      pcVar7 = *(char **)((long)pvVar3 + 0x38);
      iVar6 = strcmp(pcVar7,"SELECT");
      if ((((((iVar6 != 0) && (iVar6 = strcmp(pcVar7,"EXAMINE"), iVar6 != 0)) &&
            (iVar6 = strcmp(pcVar7,"SEARCH"), iVar6 != 0)) &&
           ((iVar6 = strcmp(pcVar7,"EXPUNGE"), iVar6 != 0 &&
            (iVar6 = strcmp(pcVar7,"LSUB"), iVar6 != 0)))) &&
          (iVar6 = strcmp(pcVar7,"UID"), iVar6 != 0)) && (iVar6 = strcmp(pcVar7,"NOOP"), iVar6 != 0)
         ) {
        return false;
      }
    }
  case IMAP_SELECT:
    goto switchD_001367a3_caseD_8;
  case IMAP_FETCH:
    pcVar7 = "FETCH";
    break;
  case IMAP_SEARCH:
    pcVar7 = "SEARCH";
  }
  _Var4 = imap_matchresp(line,len,pcVar7);
  if (!_Var4) {
    return false;
  }
switchD_001367a3_caseD_8:
  *resp = iVar5;
  _Var4 = true;
switchD_001367a3_caseD_3:
  return _Var4;
}

Assistant:

static bool imap_endofresp(struct connectdata *conn, char *line, size_t len,
                           int *resp)
{
  struct IMAP *imap = conn->data->req.protop;
  struct imap_conn *imapc = &conn->proto.imapc;
  const char *id = imapc->resptag;
  size_t id_len = strlen(id);

  /* Do we have a tagged command response? */
  if(len >= id_len + 1 && !memcmp(id, line, id_len) && line[id_len] == ' ') {
    line += id_len + 1;
    len -= id_len + 1;

    if(len >= 2 && !memcmp(line, "OK", 2))
      *resp = 'O';
    else if(len >= 2 && !memcmp(line, "NO", 2))
      *resp = 'N';
    else if(len >= 3 && !memcmp(line, "BAD", 3))
      *resp = 'B';
    else {
      failf(conn->data, "Bad tagged response");
      *resp = -1;
    }

    return TRUE;
  }

  /* Do we have an untagged command response? */
  if(len >= 2 && !memcmp("* ", line, 2)) {
    switch(imapc->state) {
      /* States which are interested in untagged responses */
      case IMAP_CAPABILITY:
        if(!imap_matchresp(line, len, "CAPABILITY"))
          return FALSE;
        break;

      case IMAP_LIST:
        if((!imap->custom && !imap_matchresp(line, len, "LIST")) ||
          (imap->custom && !imap_matchresp(line, len, imap->custom) &&
           (strcmp(imap->custom, "STORE") ||
            !imap_matchresp(line, len, "FETCH")) &&
           strcmp(imap->custom, "SELECT") &&
           strcmp(imap->custom, "EXAMINE") &&
           strcmp(imap->custom, "SEARCH") &&
           strcmp(imap->custom, "EXPUNGE") &&
           strcmp(imap->custom, "LSUB") &&
           strcmp(imap->custom, "UID") &&
           strcmp(imap->custom, "NOOP")))
          return FALSE;
        break;

      case IMAP_SELECT:
        /* SELECT is special in that its untagged responses do not have a
           common prefix so accept anything! */
        break;

      case IMAP_FETCH:
        if(!imap_matchresp(line, len, "FETCH"))
          return FALSE;
        break;

      case IMAP_SEARCH:
        if(!imap_matchresp(line, len, "SEARCH"))
          return FALSE;
        break;

      /* Ignore other untagged responses */
      default:
        return FALSE;
    }

    *resp = '*';
    return TRUE;
  }

  /* Do we have a continuation response? This should be a + symbol followed by
     a space and optionally some text as per RFC-3501 for the AUTHENTICATE and
     APPEND commands and as outlined in Section 4. Examples of RFC-4959 but
     some e-mail servers ignore this and only send a single + instead. */
  if(imap && !imap->custom && ((len == 3 && !memcmp("+", line, 1)) ||
     (len >= 2 && !memcmp("+ ", line, 2)))) {
    switch(imapc->state) {
      /* States which are interested in continuation responses */
      case IMAP_AUTHENTICATE:
      case IMAP_APPEND:
        *resp = '+';
        break;

      default:
        failf(conn->data, "Unexpected continuation response");
        *resp = -1;
        break;
    }

    return TRUE;
  }

  return FALSE; /* Nothing for us */
}